

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getCreateSubBufferArgsString
          (CLIntercept *this,cl_buffer_create_type createType,void *createInfo,string *str)

{
  ostream *poVar1;
  string *in_RCX;
  ulong *in_RDX;
  int in_ESI;
  cl_buffer_region *pRegion;
  ostringstream ss;
  string local_1d0 [32];
  ulong *local_1b0;
  ostringstream local_198 [376];
  string *local_20;
  ulong *local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (local_c == 0x1220) {
    std::operator<<((ostream *)local_198,"region = ");
    if (local_18 == (ulong *)0x0) {
      std::operator<<((ostream *)local_198,"(NULL)");
    }
    else {
      local_1b0 = local_18;
      poVar1 = std::operator<<((ostream *)local_198,"{ origin = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_1b0);
      poVar1 = std::operator<<(poVar1,", size = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0[1]);
      std::operator<<(poVar1," }");
    }
  }
  else {
    std::operator<<((ostream *)local_198,"<Unexpected!>");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(local_20,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void CLIntercept::getCreateSubBufferArgsString(
    cl_buffer_create_type createType,
    const void *createInfo,
    std::string& str ) const
{
    std::ostringstream  ss;

    switch( createType )
    {
    case CL_BUFFER_CREATE_TYPE_REGION:
        ss << "region = ";
        if( createInfo != NULL )
        {
            cl_buffer_region*   pRegion = (cl_buffer_region*)createInfo;
            ss << "{ origin = "
                << pRegion->origin
                << ", size = "
                << pRegion->size
                << " }";
        }
        else
        {
            ss << "(NULL)";
        }
        break;
    default:
        ss << "<Unexpected!>";
        break;
    }

    str = ss.str();
}